

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# route.cpp
# Opt level: O3

void __thiscall httprouter::node::node(node *this)

{
  _tree_node *__p;
  
  __p = (_tree_node *)operator_new(0x78);
  (__p->path)._M_dataplus._M_p = (pointer)&(__p->path).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__p,"");
  (__p->indices)._M_dataplus._M_p = (pointer)&(__p->indices).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__p->indices,"");
  *(undefined8 *)((long)&(__p->handle).super__Function_base._M_functor + 8) = 0;
  (__p->handle).super__Function_base._M_manager = (_Manager_type)0x0;
  (__p->children).
  super__Vector_base<std::shared_ptr<httprouter::_tree_node>,_std::allocator<std::shared_ptr<httprouter::_tree_node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(__p->handle).super__Function_base._M_functor = 0;
  (__p->children).
  super__Vector_base<std::shared_ptr<httprouter::_tree_node>,_std::allocator<std::shared_ptr<httprouter::_tree_node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->children).
  super__Vector_base<std::shared_ptr<httprouter::_tree_node>,_std::allocator<std::shared_ptr<httprouter::_tree_node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->handle)._M_invoker = (_Invoker_type)0x0;
  (this->node_).super___shared_ptr<httprouter::_tree_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<httprouter::_tree_node*>
            (&(this->node_).super___shared_ptr<httprouter::_tree_node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p);
  return;
}

Assistant:

node::node()
	:node_(new tree_node_t{
	  path:       "",
	  indices:    "",
	  children:   {},
	  handle:     nullptr,
		})
{
}